

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

void __thiscall
google::protobuf::internal::
KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
AssertLoadFactor(KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *this)

{
  uint uVar1;
  Nullable<const_char_*> failure_msg;
  map_index_t local_1c;
  LogMessageFatal local_18;
  
  local_1c = (this->super_UntypedMapBase).num_elements_;
  uVar1 = (this->super_UntypedMapBase).num_buckets_;
  local_18.super_LogMessage._0_8_ = (ulong)(uVar1 & 0xfffffffe) - (ulong)(uVar1 >> 2 & 0xfffffffc);
  failure_msg = absl::lts_20250127::log_internal::Check_LEImpl<unsigned_int,unsigned_long>
                          (&local_1c,(unsigned_long *)&local_18,
                           "num_elements_ <= CalculateHiCutoff(num_buckets_)");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_18,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.h"
             ,0x345,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_18);
}

Assistant:

void AssertLoadFactor() const {
    ABSL_DCHECK_LE(num_elements_, CalculateHiCutoff(num_buckets_));
  }